

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

void iniparser_dump(dictionary *d,FILE *f)

{
  int local_1c;
  int i;
  FILE *f_local;
  dictionary *d_local;
  
  if ((d != (dictionary *)0x0) && (f != (FILE *)0x0)) {
    for (local_1c = 0; (long)local_1c < d->size; local_1c = local_1c + 1) {
      if (d->key[local_1c] != (char *)0x0) {
        if (d->val[local_1c] == (char *)0x0) {
          fprintf((FILE *)f,"[%s]=UNDEF\n",d->key[local_1c]);
        }
        else {
          fprintf((FILE *)f,"[%s]=[%s]\n",d->key[local_1c],d->val[local_1c]);
        }
      }
    }
  }
  return;
}

Assistant:

void iniparser_dump(const dictionary * d, FILE * f)
{
    int     i ;

    if (d==NULL || f==NULL) return ;
    for (i=0 ; i<d->size ; i++) {
        if (d->key[i]==NULL)
            continue ;
        if (d->val[i]!=NULL) {
            fprintf(f, "[%s]=[%s]\n", d->key[i], d->val[i]);
        } else {
            fprintf(f, "[%s]=UNDEF\n", d->key[i]);
        }
    }
    return ;
}